

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void OptimizeHistogramSymbols
               (VP8LHistogramSet *set,uint16_t *cluster_mappings,uint32_t num_clusters,
               uint16_t *cluster_mappings_tmp,uint32_t *symbols)

{
  ushort uVar1;
  bool bVar2;
  short sVar3;
  uint uVar4;
  void *in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int cluster;
  int k;
  int do_continue;
  uint32_t cluster_max;
  uint32_t i;
  uint local_38;
  uint local_30;
  uint local_2c;
  
  bVar2 = true;
  while (bVar2) {
    bVar2 = false;
    for (local_2c = 0; local_2c < in_EDX; local_2c = local_2c + 1) {
      uVar1 = *(ushort *)(in_RSI + (ulong)local_2c * 2);
      while (local_38 = (uint)uVar1, local_38 != *(ushort *)(in_RSI + (long)(int)local_38 * 2)) {
        *(undefined2 *)(in_RSI + (long)(int)local_38 * 2) =
             *(undefined2 *)(in_RSI + (ulong)*(ushort *)(in_RSI + (long)(int)local_38 * 2) * 2);
        uVar1 = *(ushort *)(in_RSI + (long)(int)local_38 * 2);
      }
      if (local_38 != *(ushort *)(in_RSI + (ulong)local_2c * 2)) {
        bVar2 = true;
        *(ushort *)(in_RSI + (ulong)local_2c * 2) = uVar1;
      }
    }
  }
  sVar3 = 0;
  memset(in_RCX,0,(long)*(int *)(in_RDI + 4) << 1);
  for (local_2c = 0; local_2c < *(uint *)(in_RDI + 4); local_2c = local_2c + 1) {
    if (*(int *)(in_R8 + (ulong)local_2c * 4) != -1) {
      uVar4 = (uint)*(ushort *)(in_RSI + (ulong)*(uint *)(in_R8 + (ulong)local_2c * 4) * 2);
      if ((uVar4 != 0) && (*(short *)((long)in_RCX + (long)(int)uVar4 * 2) == 0)) {
        sVar3 = sVar3 + 1;
        *(short *)((long)in_RCX + (long)(int)uVar4 * 2) = sVar3;
      }
      *(uint *)(in_R8 + (ulong)local_2c * 4) =
           (uint)*(ushort *)((long)in_RCX + (long)(int)uVar4 * 2);
    }
  }
  local_30 = 0;
  for (local_2c = 0; local_2c < *(uint *)(in_RDI + 4); local_2c = local_2c + 1) {
    if ((*(int *)(in_R8 + (ulong)local_2c * 4) != -1) &&
       (local_30 < *(uint *)(in_R8 + (ulong)local_2c * 4))) {
      local_30 = local_30 + 1;
    }
  }
  return;
}

Assistant:

static void OptimizeHistogramSymbols(const VP8LHistogramSet* const set,
                                     uint16_t* const cluster_mappings,
                                     uint32_t num_clusters,
                                     uint16_t* const cluster_mappings_tmp,
                                     uint32_t* const symbols) {
  uint32_t i, cluster_max;
  int do_continue = 1;
  // First, assign the lowest cluster to each pixel.
  while (do_continue) {
    do_continue = 0;
    for (i = 0; i < num_clusters; ++i) {
      int k;
      k = cluster_mappings[i];
      while (k != cluster_mappings[k]) {
        cluster_mappings[k] = cluster_mappings[cluster_mappings[k]];
        k = cluster_mappings[k];
      }
      if (k != cluster_mappings[i]) {
        do_continue = 1;
        cluster_mappings[i] = k;
      }
    }
  }
  // Create a mapping from a cluster id to its minimal version.
  cluster_max = 0;
  memset(cluster_mappings_tmp, 0,
         set->max_size * sizeof(*cluster_mappings_tmp));
  assert(cluster_mappings[0] == 0);
  // Re-map the ids.
  for (i = 0; i < (uint32_t)set->max_size; ++i) {
    int cluster;
    if (symbols[i] == kInvalidHistogramSymbol) continue;
    cluster = cluster_mappings[symbols[i]];
    assert(symbols[i] < num_clusters);
    if (cluster > 0 && cluster_mappings_tmp[cluster] == 0) {
      ++cluster_max;
      cluster_mappings_tmp[cluster] = cluster_max;
    }
    symbols[i] = cluster_mappings_tmp[cluster];
  }

  // Make sure all cluster values are used.
  cluster_max = 0;
  for (i = 0; i < (uint32_t)set->max_size; ++i) {
    if (symbols[i] == kInvalidHistogramSymbol) continue;
    if (symbols[i] <= cluster_max) continue;
    ++cluster_max;
    assert(symbols[i] == cluster_max);
  }
}